

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

CookieInfo * Curl_cookie_init(Curl_easy *data,char *file,CookieInfo *inc,_Bool newsession)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  CookieInfo *c;
  
  c = inc;
  if (inc == (CookieInfo *)0x0) {
    c = (CookieInfo *)(*Curl_ccalloc)(1,0x28);
    if (c != (CookieInfo *)0x0) {
      pcVar5 = "none";
      if (file != (char *)0x0) {
        pcVar5 = file;
      }
      pcVar5 = (*Curl_cstrdup)(pcVar5);
      c->filename = pcVar5;
      if (pcVar5 != (char *)0x0) goto LAB_004a90ec;
      bVar2 = true;
      __stream = (FILE *)0x0;
LAB_004a9240:
      (*Curl_cfree)((void *)0x0);
      if (inc == (CookieInfo *)0x0) {
        Curl_cookie_cleanup(c);
      }
      if (__stream != (FILE *)0x0 && bVar2) {
        fclose(__stream);
      }
    }
    c = (CookieInfo *)0x0;
  }
  else {
LAB_004a90ec:
    c->running = false;
    if ((file == (char *)0x0) || (*file == '\0')) {
      c->newsession = newsession;
    }
    else {
      if ((*file == '-') && (file[1] == '\0')) {
        bVar2 = false;
        __stream = _stdin;
      }
      else {
        __stream = fopen64(file,"r");
        bVar2 = true;
      }
      c->newsession = newsession;
      if (__stream != (FILE *)0x0) {
        pcVar5 = (char *)(*Curl_cmalloc)(5000);
        if (pcVar5 == (char *)0x0) goto LAB_004a9240;
        bVar3 = false;
        while( true ) {
          bVar1 = bVar3;
          pcVar6 = fgets(pcVar5,5000,__stream);
          if (pcVar6 == (char *)0x0) break;
          sVar7 = strlen(pcVar6);
          bVar3 = true;
          if ((sVar7 != 0) &&
             (bVar3 = pcVar6[sVar7 - 1] != '\n', !(bool)(bVar1 | pcVar6[sVar7 - 1] != '\n'))) {
            iVar4 = curl_strnequal("Set-Cookie:",pcVar5,0xb);
            pcVar6 = pcVar5;
            if (iVar4 != 0) {
              pcVar6 = pcVar5 + 0xb;
            }
            for (; (*pcVar6 == ' ' || (*pcVar6 == '\t')); pcVar6 = pcVar6 + 1) {
            }
            Curl_cookie_add(data,c,iVar4 != 0,pcVar6,(char *)0x0,(char *)0x0);
            bVar3 = false;
          }
        }
        (*Curl_cfree)(pcVar5);
        if (bVar2) {
          fclose(__stream);
        }
      }
    }
    c->running = true;
  }
  return c;
}

Assistant:

struct CookieInfo *Curl_cookie_init(struct Curl_easy *data,
                                    const char *file,
                                    struct CookieInfo *inc,
                                    bool newsession)
{
  struct CookieInfo *c;
  FILE *fp = NULL;
  bool fromfile=TRUE;
  char *line = NULL;

  if(NULL == inc) {
    /* we didn't get a struct, create one */
    c = calloc(1, sizeof(struct CookieInfo));
    if(!c)
      return NULL; /* failed to get memory */
    c->filename = strdup(file?file:"none"); /* copy the name just in case */
    if(!c->filename)
      goto fail; /* failed to get memory */
  }
  else {
    /* we got an already existing one, use that */
    c = inc;
  }
  c->running = FALSE; /* this is not running, this is init */

  if(file && !strcmp(file, "-")) {
    fp = stdin;
    fromfile=FALSE;
  }
  else if(file && !*file) {
    /* points to a "" string */
    fp = NULL;
  }
  else
    fp = file?fopen(file, FOPEN_READTEXT):NULL;

  c->newsession = newsession; /* new session? */

  if(fp) {
    char *lineptr;
    bool headerline;

    line = malloc(MAX_COOKIE_LINE);
    if(!line)
      goto fail;
    while(get_line(line, MAX_COOKIE_LINE, fp)) {
      if(checkprefix("Set-Cookie:", line)) {
        /* This is a cookie line, get it! */
        lineptr=&line[11];
        headerline=TRUE;
      }
      else {
        lineptr=line;
        headerline=FALSE;
      }
      while(*lineptr && ISBLANK(*lineptr))
        lineptr++;

      Curl_cookie_add(data, c, headerline, lineptr, NULL, NULL);
    }
    free(line); /* free the line buffer */

    if(fromfile)
      fclose(fp);
  }

  c->running = TRUE;          /* now, we're running */

  return c;

fail:
  free(line);
  if(!inc)
    /* Only clean up if we allocated it here, as the original could still be in
     * use by a share handle */
    Curl_cookie_cleanup(c);
  if(fromfile && fp)
    fclose(fp);
  return NULL; /* out of memory */
}